

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O3

int __thiscall
GameTitle::calculateNewPosition
          (GameTitle *this,int currentPos,int animationLength,int start,int finish,bool direction)

{
  int iVar1;
  int iVar2;
  undefined3 in_register_00000089;
  int finish_local;
  
  iVar1 = (finish - start) / (animationLength * 0x18);
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  if (CONCAT31(in_register_00000089,direction) == 0) {
    if (finish <= currentPos - iVar2) {
      return currentPos - iVar2;
    }
  }
  else if (iVar2 + currentPos < finish) {
    return iVar2 + currentPos;
  }
  return finish;
}

Assistant:

int GameTitle::calculateNewPosition(int currentPos, int animationLength, int start, volatile int finish, bool direction) {
    double positionMove = (finish - start) / (animationLength * FRAMES_PER_SECOND);

    if(positionMove < 1){
        positionMove = 1;
    }

    if(direction == DOWN){
        currentPos += positionMove;

        if(currentPos >= finish){
            currentPos = finish;
        }

        return currentPos;
    }
    else {
        currentPos -= positionMove;

        if(currentPos < finish){
            currentPos = finish;
        }

        return currentPos;
    }

}